

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::AddToEvalMap
          (ScriptContext *this,FastEvalMapString *key,BOOL isIndirect,ScriptFunction *pfuncScript)

{
  byte bVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  
  if ((((pfuncScript->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
       attributes & Generator) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xb4e,"(!pfuncScript->GetFunctionInfo()->IsGenerator())",
                                "!pfuncScript->GetFunctionInfo()->IsGenerator()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pFVar6 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  pUVar2 = (pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar4 = IsScriptContextInDebugMode(this);
  if (((bVar4) && (bVar1 = pUVar2->field_0xa8, (bVar1 & 4) == 0)) &&
     (((bVar1 & 0x40) == 0 || ((bVar1 & 0x20) == 0 && (pUVar2->debugModeSource).ptr == (uchar *)0x0)
      ))) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  if (this->TTDRecordOrReplayModeEnabled != false) {
    return;
  }
  AddToEvalMapHelper(this,key,isIndirect,pfuncScript);
  return;
}

Assistant:

void ScriptContext::AddToEvalMap(FastEvalMapString & key, BOOL isIndirect, ScriptFunction *pfuncScript)
    {
        Assert(!pfuncScript->GetFunctionInfo()->IsGenerator());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
        if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // Identifying if any non library function escaped for not being in debug mode.
            Throw::FatalInternalError();
        }
#endif

#if ENABLE_TTD
        if(!this->IsTTDRecordOrReplayModeEnabled())
        {
            this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
        }
#else
        this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
#endif
    }